

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void movups_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  undefined8 uVar3;
  Int32 IVar4;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).PrefRepne == 1) {
      (pMyDisasm->Prefix).RepnePrefix = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Instruction).Category = 0x50002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movsd",6);
    }
    else {
      if ((pMyDisasm->Reserved_).PrefRepe != 1) {
        if ((pMyDisasm->Prefix).OperandSize == '\x01') {
          (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
          (pMyDisasm->Prefix).OperandSize = '\b';
          (pMyDisasm->Reserved_).MemDecoration = 0x6d;
          (pMyDisasm->Instruction).Category = 0x50002;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movupd",7);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 0x6d;
          (pMyDisasm->Instruction).Category = 0x40002;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movups",7);
        }
LAB_0011665f:
        (pMyDisasm->Reserved_).Register_ = 4;
        GxEx(pMyDisasm);
        return;
      }
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      (pMyDisasm->Instruction).Category = 0x40002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movss",6);
    }
LAB_0011655e:
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar1 != '\x01') {
    if (UVar1 == '\x02') {
      UVar1 = (pMyDisasm->Reserved_).VEX.vvvv;
      UVar2 = (pMyDisasm->Reserved_).EVEX.state;
      IVar4 = 0x110000;
      if (UVar2 == '\x01') {
        IVar4 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar4;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovss",7);
      if (UVar1 == '\x0f') {
        if (UVar2 == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
        }
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        goto LAB_0011665f;
      }
    }
    else {
      if (UVar1 != '\x03') {
        uVar3 = 0x737075766f6d76;
        goto LAB_00116623;
      }
      UVar1 = (pMyDisasm->Reserved_).VEX.vvvv;
      UVar2 = (pMyDisasm->Reserved_).EVEX.state;
      IVar4 = 0x110000;
      if (UVar2 == '\x01') {
        IVar4 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar4;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovsd",7);
      if (UVar1 == '\x0f') {
        if (UVar2 == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
        }
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        goto LAB_0011655e;
      }
    }
    ArgsVEX(pMyDisasm);
    return;
  }
  uVar3 = 0x647075766f6d76;
LAB_00116623:
  *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
  }
  vex_GxEx(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ movups_VW(PDISASM pMyDisasm)
{
   if (GV.VEX.state == InUsePrefix) {
     if (GV.VEX.pp == 0x3) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
       if (GV.VEX.vvvv == 0xF) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovsd");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
         GV.MemDecoration = Arg2qword;
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovsd");
         #endif
         ArgsVEX(pMyDisasm);
       }
     }
     else if (GV.VEX.pp == 0x2) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
       if (GV.VEX.vvvv == 0xF) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovss");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
         GV.MemDecoration = Arg2dword;
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
       } else {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovss");
         #endif
         ArgsVEX(pMyDisasm);
       }
     }
     else if (GV.VEX.pp == 0x1) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovupd");
       #endif
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
       vex_GxEx(pMyDisasm);
     }
     else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovups");
       #endif
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
       vex_GxEx(pMyDisasm);
     }
   } else {
     /* ========= 0xf2 */
     if (GV.PrefRepne == 1) {
         pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
         GV.MemDecoration = Arg2qword;
         pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movsd");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
     }
     /* ========= 0xf3 */
     else if (GV.PrefRepe == 1) {
         pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
         GV.MemDecoration = Arg2dword;
         pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movss");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

     }
     /* ========== 0x66 */
     else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
         GV.OperandSize = GV.OriginalOperandSize;
         pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
         GV.MemDecoration = Arg2_m128_xmm;
         pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movupd");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);

     }
     else {
         GV.MemDecoration = Arg2_m128_xmm;
         pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movups");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);

     }
   }
}